

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O1

void Abc_NtkSetAndGateDelay(void *pAbc0,float Delay)

{
  Abc_Ntk_t *pAVar1;
  char *__s;
  
  if (pAbc0 == (void *)0x0) {
    __s = "ABC framework is not initialized by calling Abc_Start()";
  }
  else {
    pAVar1 = Abc_FrameReadNtk((Abc_Frame_t *)pAbc0);
    if (pAVar1 != (Abc_Ntk_t *)0x0) {
      pAVar1->AndGateDelay = Delay;
      return;
    }
    __s = "Current network in ABC framework is not defined.";
  }
  puts(__s);
  return;
}

Assistant:

void Abc_NtkSetAndGateDelay( void * pAbc0, float Delay )
{
    Abc_Frame_t * pAbc = (Abc_Frame_t *)pAbc0;
    Abc_Ntk_t * pNtk;
    if ( pAbc == NULL )
    {
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
        return;
    }
    pNtk = Abc_FrameReadNtk( pAbc );
    if ( pNtk == NULL )
    {
        printf( "Current network in ABC framework is not defined.\n" );
        return;
    }
    pNtk->AndGateDelay = Delay;
}